

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void exprListDeleteNN(sqlite3 *db,ExprList *pList)

{
  ExprList_item *local_28;
  ExprList_item *pItem;
  int i;
  ExprList *pList_local;
  sqlite3 *db_local;
  
  pItem._4_4_ = pList->nExpr;
  local_28 = pList->a;
  do {
    sqlite3ExprDelete(db,local_28->pExpr);
    if (local_28->zEName != (char *)0x0) {
      sqlite3DbNNFreeNN(db,local_28->zEName);
    }
    local_28 = local_28 + 1;
    pItem._4_4_ = pItem._4_4_ + -1;
  } while (0 < pItem._4_4_);
  sqlite3DbNNFreeNN(db,pList);
  return;
}

Assistant:

static SQLITE_NOINLINE void exprListDeleteNN(sqlite3 *db, ExprList *pList){
  int i = pList->nExpr;
  struct ExprList_item *pItem =  pList->a;
  assert( pList->nExpr>0 );
  assert( db!=0 );
  do{
    sqlite3ExprDelete(db, pItem->pExpr);
    if( pItem->zEName ) sqlite3DbNNFreeNN(db, pItem->zEName);
    pItem++;
  }while( --i>0 );
  sqlite3DbNNFreeNN(db, pList);
}